

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparateApprovedAndReceivedDirectoriesNamer.cpp
# Opt level: O1

void __thiscall
ApprovalTests::SeparateApprovedAndReceivedDirectoriesNamer::
SeparateApprovedAndReceivedDirectoriesNamer(SeparateApprovedAndReceivedDirectoriesNamer *this)

{
  size_type sVar1;
  pointer __dest;
  size_type __dnew;
  string local_50;
  size_type local_30;
  
  local_30 = 0x70;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  __dest = (pointer)::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
  sVar1 = local_30;
  local_50.field_2._M_allocated_capacity = local_30;
  local_50._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "{TestSourceDirectory}/{ApprovalsSubdirectory}/{ApprovedOrReceived}/{TestFileName}.{TestCaseName}.{FileExtension}"
         ,0x70);
  local_50._M_string_length = sVar1;
  __dest[sVar1] = '\0';
  TemplatedCustomNamer::TemplatedCustomNamer(&this->super_TemplatedCustomNamer,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_TemplatedCustomNamer).super_ApprovalNamer._vptr_ApprovalNamer =
       (_func_int **)&PTR__TemplatedCustomNamer_001d36a0;
  return;
}

Assistant:

SeparateApprovedAndReceivedDirectoriesNamer::
        SeparateApprovedAndReceivedDirectoriesNamer()
        : TemplatedCustomNamer(separateDirectoryPath())
    {
    }